

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::operator++(BN *this)

{
  iterator __position;
  unsigned_short *i;
  unsigned_short *puVar1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  int local_c;
  
  puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar1 == __position._M_current) {
      local_c = 1;
      if (__position._M_current ==
          (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<int>
                  (&this->ba,__position,&local_c);
      }
      else {
        *__position._M_current = 1;
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      return this;
    }
    *puVar1 = *puVar1 + 1;
    if (*puVar1 != 0) break;
    puVar1 = puVar1 + 1;
  }
  return this;
}

Assistant:

BN & BN::operator ++()
{
    for (auto& i : ba) {
        ++i;
        if (i != 0)
            return *this;
    }
    ba.emplace_back(1);
    return *this;
}